

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaggedInt.cpp
# Opt level: O2

Var Js::TaggedInt::Modulus(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  uint uVar1;
  uint uVar2;
  undefined1 *puVar3;
  
  uVar1 = ToInt32(aLeft);
  uVar2 = ToInt32(aRight);
  if (((int)uVar1 < 1) || ((uVar2 + 0x7fffffff & uVar2) != 0 || (int)uVar2 < 1)) {
    if (uVar2 == 0) {
      puVar3 = (undefined1 *)
               (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).nan.ptr;
    }
    else {
      puVar3 = &DAT_1000000000000;
      if (uVar1 != 0) {
        if (uVar2 != 0xffffffff || uVar1 != 0x80000000) {
          if ((int)((long)(int)uVar1 % (long)(int)uVar2) != 0) {
            return (Var)((long)(int)uVar1 % (long)(int)uVar2 & 0xffffffffU | 0x1000000000000);
          }
          if (-1 < (int)uVar1) {
            return &DAT_1000000000000;
          }
        }
        puVar3 = (undefined1 *)
                 (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).negativeZero.ptr;
      }
    }
  }
  else {
    puVar3 = (undefined1 *)((ulong)(uVar2 + 0x7fffffff & uVar1) | 0x1000000000000);
  }
  return puVar3;
}

Assistant:

Var TaggedInt::Modulus(Var aLeft, Var aRight, ScriptContext* scriptContext)
    {
        int nLeft    = ToInt32(aLeft);
        int nRight   = ToInt32(aRight);

        // nLeft is positive and nRight is +2^i
        // Fast path for Power of 2 divisor
        if (nLeft > 0 && ::Math::IsPow2(nRight))
        {
            return ToVarUnchecked(nLeft & (nRight - 1));
        }

        if (nRight == 0)
        {
            return scriptContext->GetLibrary()->GetNaN();
        }

        if (nLeft == 0)
        {
          return ToVarUnchecked(0);
        }
        int result;
#if INT32VAR
        // 0x80000000 / -1 (or %) will trigger an integer overflow exception
        if (nLeft != INT_MIN || nRight != -1)
        {
#endif
            result = nLeft % nRight;

#if INT32VAR
        }
        else
        {
            int64 left64 = nLeft;
            int64 right64 = nRight;
            result = (int)(left64 % right64);
        }
#endif
        if (result != 0)
        {
            return ToVarUnchecked(result);
        }
        else
        {
            //
            // return -0 if left is negative
            //

            if (nLeft >= 0)
            {
                return ToVarUnchecked(0);
            }
            else
            {
                return scriptContext->GetLibrary()->GetNegativeZero();
            }
        }
    }